

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.h
# Opt level: O3

bool __thiscall FxExpression::IsObject(FxExpression *this)

{
  PType *pPVar1;
  PClass *pPVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  bool bVar6;
  PClass *pPVar5;
  
  pPVar2 = PPointer::RegistrationInfo.MyClass;
  pPVar1 = this->ValueType;
  pPVar5 = (pPVar1->super_PTypeBase).super_DObject.Class;
  if (pPVar5 == (PClass *)0x0) {
    iVar4 = (**(pPVar1->super_PTypeBase).super_DObject._vptr_DObject)(pPVar1);
    pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
    (pPVar1->super_PTypeBase).super_DObject.Class = pPVar5;
  }
  pPVar3 = PClassPointer::RegistrationInfo.MyClass;
  bVar6 = pPVar5 != (PClass *)0x0;
  if (pPVar5 != pPVar2 && bVar6) {
    do {
      pPVar5 = pPVar5->ParentClass;
      bVar6 = pPVar5 != (PClass *)0x0;
      if (pPVar5 == pPVar2) break;
    } while (pPVar5 != (PClass *)0x0);
  }
  if (bVar6) {
    pPVar1 = this->ValueType;
    pPVar5 = (pPVar1->super_PTypeBase).super_DObject.Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar4 = (**(pPVar1->super_PTypeBase).super_DObject._vptr_DObject)(pPVar1);
      pPVar5 = (PClass *)CONCAT44(extraout_var_00,iVar4);
      (pPVar1->super_PTypeBase).super_DObject.Class = pPVar5;
    }
    pPVar2 = PClass::RegistrationInfo.MyClass;
    bVar6 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar3 && bVar6) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar6 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar3) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if ((!bVar6) && ((PPointer *)this->ValueType != TypeNullPtr)) {
      pPVar1 = ((PPointer *)this->ValueType)->PointedType;
      pPVar5 = (pPVar1->super_PTypeBase).super_DObject.Class;
      if (pPVar5 == (PClass *)0x0) {
        iVar4 = (**(pPVar1->super_PTypeBase).super_DObject._vptr_DObject)(pPVar1);
        pPVar5 = (PClass *)CONCAT44(extraout_var_01,iVar4);
        (pPVar1->super_PTypeBase).super_DObject.Class = pPVar5;
      }
      if (pPVar5 == pPVar2 || pPVar5 == (PClass *)0x0) {
        return pPVar5 != (PClass *)0x0;
      }
      do {
        pPVar5 = pPVar5->ParentClass;
        if (pPVar5 == pPVar2) {
          return pPVar5 != (PClass *)0x0;
        }
      } while (pPVar5 != (PClass *)0x0);
      return pPVar5 != (PClass *)0x0;
    }
  }
  return false;
}

Assistant:

bool IsObject() const { return ValueType->IsKindOf(RUNTIME_CLASS(PPointer)) && !ValueType->IsKindOf(RUNTIME_CLASS(PClassPointer)) && ValueType != TypeNullPtr && static_cast<PPointer*>(ValueType)->PointedType->IsKindOf(RUNTIME_CLASS(PClass)); }